

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viewer.cpp
# Opt level: O2

int __thiscall CMU462::Viewer::init(Viewer *this,EVP_PKEY_CTX *ctx)

{
  long *plVar1;
  int iVar2;
  GLenum GVar3;
  OSDText *pOVar4;
  ostream *poVar5;
  int height;
  string *text;
  Color color;
  Color color_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string title;
  string local_50;
  string local_30;
  
  glfwSetErrorCallback(err_callback);
  iVar2 = glfwInit();
  if (iVar2 == 0) {
    poVar5 = std::operator<<((ostream *)&std::cout,"\x1b[31m");
    poVar5 = std::operator<<(poVar5,"[CMU462] ");
    poVar5 = std::operator<<(poVar5,"\x1b[0m");
    poVar5 = std::operator<<(poVar5,"Error: could not initialize GLFW!");
    poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
    std::flush<char,std::char_traits<char>>(poVar5);
  }
  else {
    if (renderer == (long *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&title,"CMU462",(allocator<char> *)&local_90);
    }
    else {
      (**(code **)(*renderer + 0x28))(&local_90);
      std::operator+(&title,"CMU462: ",&local_90);
      std::__cxx11::string::~string((string *)&local_90);
    }
    window = glfwCreateWindow(0x3c0,0x280,title._M_dataplus._M_p,(GLFWmonitor *)0x0,
                              (GLFWwindow *)0x0);
    if (window == (GLFWwindow *)0x0) {
      poVar5 = std::operator<<((ostream *)&std::cout,"\x1b[31m");
      poVar5 = std::operator<<(poVar5,"[CMU462] ");
      poVar5 = std::operator<<(poVar5,"\x1b[0m");
      poVar5 = std::operator<<(poVar5,"Error: could not create window!");
      std::endl<char,std::char_traits<char>>(poVar5);
      std::ostream::flush();
      glfwTerminate();
    }
    else {
      glfwMakeContextCurrent(window);
      glfwSwapInterval(1);
      glfwSetFramebufferSizeCallback(window,resize_callback);
      glfwSetKeyCallback(window,key_callback);
      glfwSetCharCallback(window,char_callback);
      glfwSetCursorPosCallback(window,cursor_callback);
      glfwSetScrollCallback(window,scroll_callback);
      glfwSetInputMode(window,0x33003,1);
      glfwSetMouseButtonCallback(window,mouse_button_callback);
      GVar3 = glewInit();
      if (GVar3 == 0) {
        glEnable(0xbe2);
        glBlendFunc(0x302,0x303);
        glfwGetFramebufferSize(window,(int *)&buffer_w,(int *)&buffer_h);
        plVar1 = renderer;
        if (0x3c0 < buffer_w) {
          HDPI = 1;
        }
        if (renderer != (long *)0x0) {
          if (HDPI == 1) {
            *(undefined1 *)(renderer + 1) = 1;
          }
          (**(code **)(*plVar1 + 0x10))();
        }
        pOVar4 = (OSDText *)operator_new(0x60);
        OSDText::OSDText(pOVar4);
        osd_text = pOVar4;
        iVar2 = OSDText::init(pOVar4,(EVP_PKEY_CTX *)(ulong)HDPI);
        pOVar4 = osd_text;
        if (-1 < iVar2) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_30,"Renderer",(allocator<char> *)&local_90);
          color.b = 0.15;
          color.a = 1.0;
          color.r = 0.15;
          color.g = 0.5;
          line_id_renderer = OSDText::add_line(pOVar4,-0.95,0.9,&local_30,0x12,color);
          std::__cxx11::string::~string((string *)&local_30);
          pOVar4 = osd_text;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_50,"Framerate",(allocator<char> *)&local_90);
          text = &local_50;
          color_00.b = 0.15;
          color_00.a = 1.0;
          color_00.r = 0.15;
          color_00.g = 0.5;
          line_id_framerate = OSDText::add_line(pOVar4,-0.98,-0.96,text,0xe,color_00);
          iVar2 = (int)text;
          std::__cxx11::string::~string((string *)&local_50);
          resize_callback(window,iVar2,height);
          iVar2 = std::__cxx11::string::~string((string *)&title);
          return iVar2;
        }
        poVar5 = std::operator<<((ostream *)&std::cout,"\x1b[31m");
        poVar5 = std::operator<<(poVar5,"[CMU462] ");
        poVar5 = std::operator<<(poVar5,"\x1b[0m");
        poVar5 = std::operator<<(poVar5,"Error: could not initialize on-screen display!");
        std::endl<char,std::char_traits<char>>(poVar5);
        std::ostream::flush();
      }
      else {
        poVar5 = std::operator<<((ostream *)&std::cout,"\x1b[31m");
        poVar5 = std::operator<<(poVar5,"[CMU462] ");
        poVar5 = std::operator<<(poVar5,"\x1b[0m");
        poVar5 = std::operator<<(poVar5,"Error: could not initialize GLEW!");
        std::endl<char,std::char_traits<char>>(poVar5);
        std::ostream::flush();
        glfwTerminate();
      }
    }
  }
  exit(1);
}

Assistant:

void Viewer::init() {

  // initialize glfw
  glfwSetErrorCallback( err_callback );
  if( !glfwInit() ) {
    out_err("Error: could not initialize GLFW!");
    exit( 1 );
  }

  // create window
  string title = renderer ? "CMU462: " + renderer->name() : "CMU462";
  window = glfwCreateWindow( DEFAULT_W, DEFAULT_H, title.c_str(), NULL, NULL );
  if (!window) {
    out_err("Error: could not create window!");
    glfwTerminate();
    exit( 1 );
  }

  // set context
  glfwMakeContextCurrent( window );
  glfwSwapInterval(1);

  // framebuffer event callbacks
  glfwSetFramebufferSizeCallback( window, resize_callback );
  
  // key event callbacks
  glfwSetKeyCallback( window, key_callback );

  // character event callbacks
  glfwSetCharCallback( window, char_callback );
  
  // cursor event callbacks
  glfwSetCursorPosCallback( window, cursor_callback );

  // wheel event callbacks
  glfwSetScrollCallback(window, scroll_callback);  
  
  // mouse button callbacks
  glfwSetInputMode(window, GLFW_STICKY_MOUSE_BUTTONS, 1);
  glfwSetMouseButtonCallback(window, mouse_button_callback);

  // initialize glew
  if (glewInit() != GLEW_OK) {
    out_err("Error: could not initialize GLEW!");
    glfwTerminate();
    exit( 1 );
  }

  // enable alpha blending
  glEnable(GL_BLEND);
  glBlendFunc(GL_SRC_ALPHA, GL_ONE_MINUS_SRC_ALPHA);

  // resize components to current window size, get DPI
  glfwGetFramebufferSize(window, (int*) &buffer_w, (int*) &buffer_h );
  if( buffer_w > DEFAULT_W ) HDPI = true;

  // initialize renderer if already set
  if (renderer){
    if (HDPI) renderer->use_hdpi_reneder_target();
    renderer->init();
  } 

  // initialize status OSD
  osd_text = new OSDText();
  if (osd_text->init(HDPI) < 0) {
    out_err("Error: could not initialize on-screen display!");
    exit( 1 );
  }
  
  // add lines for renderer and fps
  line_id_renderer  = osd_text->add_line(-0.95,  0.90, "Renderer", 
                                          18, Color(0.15, 0.5, 0.15));
  line_id_framerate = osd_text->add_line(-0.98, -0.96, "Framerate", 
                                          14, Color(0.15, 0.5, 0.15));

  // resize elements to current size
  resize_callback(window, buffer_w, buffer_h);

}